

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_bitset_container_lazy_union
               (run_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  _Bool _Var1;
  int local_24;
  rle16_t rle;
  int32_t rlepos;
  bitset_container_t *dst_local;
  bitset_container_t *src_2_local;
  run_container_t *src_1_local;
  
  _Var1 = run_container_is_full(src_1);
  if (!_Var1) {
    if (src_2 != dst) {
      bitset_container_copy(src_2,dst);
    }
    for (local_24 = 0; local_24 < src_1->n_runs; local_24 = local_24 + 1) {
      bitset_set_lenrange(dst->words,(uint)src_1->runs[local_24] & 0xffff,
                          (uint)src_1->runs[local_24] >> 0x10);
    }
    dst->cardinality = -1;
    return;
  }
  __assert_fail("!run_container_is_full(src_1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x34af,
                "void run_bitset_container_lazy_union(const run_container_t *, const bitset_container_t *, bitset_container_t *)"
               );
}

Assistant:

void run_bitset_container_lazy_union(const run_container_t *src_1,
                                     const bitset_container_t *src_2,
                                     bitset_container_t *dst) {
    assert(!run_container_is_full(src_1));  // catch this case upstream
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_set_lenrange(dst->words, rle.value, rle.length);
    }
    dst->cardinality = BITSET_UNKNOWN_CARDINALITY;
}